

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

void __thiscall duckdb::Event::CompleteDependency(Event *this)

{
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  
  LOCK();
  paVar1 = &this->finished_dependencies;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if (_Var2 + 1 == this->total_dependencies) {
    (*this->_vptr_Event[2])();
    if ((this->total_tasks).super___atomic_base<unsigned_long>._M_i == 0) {
      Finish(this);
      return;
    }
  }
  return;
}

Assistant:

void Event::CompleteDependency() {
	idx_t current_finished = ++finished_dependencies;
	D_ASSERT(current_finished <= total_dependencies);
	if (current_finished == total_dependencies) {
		// all dependencies have been completed: schedule the event
		D_ASSERT(total_tasks == 0);
		Schedule();
		if (total_tasks == 0) {
			Finish();
		}
	}
}